

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_DACCtrl_Setup(VGMPlayer *this)

{
  UINT8 UVar1;
  pointer pDVar2;
  UINT8 UVar3;
  UINT8 *pUVar4;
  CHIP_DEVICE *devInf;
  ulong uVar5;
  size_t sVar6;
  DEV_GEN_CFG devCfg;
  DACSTRM_DEV dacStrm;
  
  pUVar4 = this->_fileData;
  uVar5 = (ulong)this->_filePos;
  sVar6 = this->_dacStrmMap[pUVar4[uVar5 + 1]];
  if (sVar6 == 0xffffffffffffffff) {
    if (pUVar4[uVar5 + 1] == 0xff) {
      return;
    }
    devCfg.emuCore = 0;
    devCfg.srMode = '\0';
    devCfg.flags = '\0';
    devCfg.clock = 0;
    devCfg.smplRate = (this->super_PlayerBase)._outSmplRate;
    UVar3 = device_start_daccontrol(&devCfg,&dacStrm.defInf);
    if (UVar3 != '\0') {
      return;
    }
    (*(dacStrm.defInf.devDef)->Reset)(dacStrm.defInf.dataPtr);
    dacStrm.streamID = this->_fileData[(ulong)this->_filePos + 1];
    dacStrm.bankID = 0xff;
    dacStrm.pbMode = '\0';
    dacStrm.freq = 0;
    dacStrm.lastItem = 0xffffffff;
    dacStrm.maxItems = 0;
    this->_dacStrmMap[dacStrm.streamID] =
         ((long)(this->_dacStreams).
                super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->_dacStreams).
               super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x38;
    std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::push_back
              (&this->_dacStreams,&dacStrm);
    sVar6 = this->_dacStrmMap[dacStrm.streamID];
    pUVar4 = this->_fileData;
    uVar5 = (ulong)this->_filePos;
  }
  pDVar2 = (this->_dacStreams).
           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  UVar3 = pUVar4[uVar5 + 3];
  UVar1 = pUVar4[uVar5 + 4];
  devInf = GetDevicePtr(this,pUVar4[uVar5 + 2] & 0x7f,pUVar4[uVar5 + 2] >> 7);
  if (devInf != (CHIP_DEVICE *)0x0) {
    daccontrol_setup_chip
              (pDVar2[sVar6].defInf.dataPtr,(DEV_INFO *)devInf,devInf->chipType,
               CONCAT11(UVar3,UVar1));
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Setup(void)	// DAC Stream Control: Setup Chip
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
	{
		if (fData[0x01] == 0xFF)
			return;
		
		DEV_GEN_CFG devCfg;
		DACSTRM_DEV dacStrm;
		UINT8 retVal;
		
		devCfg.emuCore = 0x00;
		devCfg.srMode = DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 0;
		devCfg.smplRate = _outSmplRate;
		retVal = device_start_daccontrol(&devCfg, &dacStrm.defInf);
		if (retVal)
			return;
		dacStrm.defInf.devDef->Reset(dacStrm.defInf.dataPtr);
		dacStrm.streamID = fData[0x01];
		dacStrm.bankID = 0xFF;
		dacStrm.pbMode = 0x00;
		dacStrm.freq = 0;
		dacStrm.lastItem = (UINT32)-1;
		dacStrm.maxItems = 0;
		
		_dacStrmMap[dacStrm.streamID] = _dacStreams.size();
		_dacStreams.push_back(dacStrm);
		
		dsID = _dacStrmMap[dacStrm.streamID];
	}
	
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	UINT8 chipType = fData[0x02] & 0x7F;
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	UINT16 chipCmd = ReadBE16(&fData[0x03]);
	CHIP_DEVICE* destChip = GetDevicePtr(chipType, chipID);
	if (destChip == NULL)
		return;
	
	daccontrol_setup_chip(dacStrm->defInf.dataPtr, &destChip->base.defInf, destChip->chipType, chipCmd);
	return;
}